

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

void __thiscall aeron::archive::Configuration::Configuration(Configuration *this)

{
  bool bVar1;
  int32_t iVar2;
  int64_t iVar3;
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [48];
  Configuration *local_10;
  Configuration *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)&this->controlChannel);
  std::__cxx11::string::string((string *)&this->localControlChannel);
  std::__cxx11::string::string((string *)&this->controlResponseChannel);
  std::__cxx11::string::string((string *)&this->recordingEventsChannel);
  iVar3 = anon_unknown.dwarf_8cd6::getMessageTimeout();
  this->messageTimeoutNs = iVar3;
  (anonymous_namespace)::getControlChannel_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&this->controlChannel,local_40);
  std::__cxx11::string::~string(local_40);
  iVar2 = anon_unknown.dwarf_8cd6::getControlStreamId();
  this->controlStreamId = iVar2;
  (anonymous_namespace)::getLocalControlChannel_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&this->localControlChannel,local_60);
  std::__cxx11::string::~string(local_60);
  iVar2 = anon_unknown.dwarf_8cd6::getLocalControlStreamId();
  this->localControlStreamId = iVar2;
  (anonymous_namespace)::getControlResponseChannel_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&this->controlResponseChannel,local_80);
  std::__cxx11::string::~string(local_80);
  iVar2 = anon_unknown.dwarf_8cd6::getControlResponseStreamId();
  this->controlResponseStreamId = iVar2;
  (anonymous_namespace)::getRecordingEventsChannel_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&this->recordingEventsChannel,local_a0);
  std::__cxx11::string::~string(local_a0);
  iVar2 = anon_unknown.dwarf_8cd6::getRecordingEventsStreamId();
  this->recordingEventsStreamId = iVar2;
  bVar1 = anon_unknown.dwarf_8cd6::getControlTermBufferSparse();
  this->controlTermBufferSparse = bVar1;
  iVar2 = anon_unknown.dwarf_8cd6::getControlTermBufferLength();
  this->controlTermBufferLength = iVar2;
  iVar2 = anon_unknown.dwarf_8cd6::getControlMtuLength();
  this->controlMtuLength = iVar2;
  return;
}

Assistant:

Configuration::Configuration() {
    messageTimeoutNs = getMessageTimeout();
    controlChannel = getControlChannel();
    controlStreamId = getControlStreamId();
    localControlChannel = getLocalControlChannel();
    localControlStreamId = getLocalControlStreamId();
    controlResponseChannel = getControlResponseChannel();
    controlResponseStreamId = getControlResponseStreamId();
    recordingEventsChannel = getRecordingEventsChannel();
    recordingEventsStreamId = getRecordingEventsStreamId();
    controlTermBufferSparse = getControlTermBufferSparse();
    controlTermBufferLength = getControlTermBufferLength();
    controlMtuLength = getControlMtuLength();
}